

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O1

bool slang::ast::checkPackedUnionTag
               (Type *valueType,SVInt *val,uint32_t expectedTag,EvalContext *context,
               SourceRange sourceRange,string_view memberName)

{
  optional<unsigned_int> oVar1;
  Diagnostic *this;
  bool bVar2;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  
  bVar2 = true;
  if (valueType[2].super_Symbol.kind != Unknown) {
    SVInt::slice((SVInt *)&local_40,(int32_t)val,(val->super_SVIntStorage).bitWidth - 1);
    oVar1 = SVInt::as<unsigned_int>((SVInt *)&local_40);
    if (((0x40 < local_38) || ((local_33 & 1) != 0)) && ((void *)local_40.val != (void *)0x0)) {
      operator_delete__(local_40.pVal);
    }
    if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    if (oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload != expectedTag) {
      this = EvalContext::addDiag(context,(DiagCode)0x1c000c,sourceRange);
      Diagnostic::operator<<(this,memberName);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

static bool checkPackedUnionTag(const Type& valueType, const SVInt& val, uint32_t expectedTag,
                                EvalContext& context, SourceRange sourceRange,
                                std::string_view memberName) {
    uint32_t tagBits = valueType.as<PackedUnionType>().tagBits;
    if (tagBits) {
        bitwidth_t bits = val.getBitWidth();
        auto tag = val.slice(int32_t(bits - 1), int32_t(bits - tagBits)).as<uint32_t>();
        if (tag.value() != expectedTag) {
            context.addDiag(diag::ConstEvalTaggedUnion, sourceRange) << memberName;
            return false;
        }
    }

    return true;
}